

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void Curl_expire_clear(Curl_easy *data)

{
  timeval *ptVar1;
  Curl_multi *pCVar2;
  uint uVar3;
  
  pCVar2 = data->multi;
  if ((pCVar2 != (Curl_multi *)0x0) &&
     ((ptVar1 = &(data->state).expiretime, ptVar1->tv_sec != 0 ||
      ((data->state).expiretime.tv_usec != 0)))) {
    uVar3 = Curl_splayremovebyaddr(pCVar2->timetree,&(data->state).timenode,&pCVar2->timetree);
    if (uVar3 != 0) {
      Curl_infof(data,"Internal error clearing splay node = %d\n",(ulong)uVar3);
    }
    if ((data->state).timeoutlist.size != 0) {
      do {
        Curl_llist_remove(&(data->state).timeoutlist,(data->state).timeoutlist.tail,(void *)0x0);
      } while ((data->state).timeoutlist.size != 0);
    }
    ptVar1->tv_sec = 0;
    (data->state).expiretime.tv_usec = 0;
  }
  return;
}

Assistant:

void Curl_expire_clear(struct Curl_easy *data)
{
  struct Curl_multi *multi = data->multi;
  struct timeval *nowp = &data->state.expiretime;
  int rc;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  if(nowp->tv_sec || nowp->tv_usec) {
    /* Since this is an cleared time, we must remove the previous entry from
       the splay tree */
    struct curl_llist *list = &data->state.timeoutlist;

    rc = Curl_splayremovebyaddr(multi->timetree,
                                &data->state.timenode,
                                &multi->timetree);
    if(rc)
      infof(data, "Internal error clearing splay node = %d\n", rc);

    /* flush the timeout list too */
    while(list->size > 0) {
      Curl_llist_remove(list, list->tail, NULL);
    }

#ifdef DEBUGBUILD
    infof(data, "Expire cleared\n");
#endif
    nowp->tv_sec = 0;
    nowp->tv_usec = 0;
  }
}